

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gluTextureUtil.cpp
# Opt level: O3

TextureFormat glu::mapGLInternalFormat(deUint32 internalFormat)

{
  ulong uVar1;
  InternalError *this;
  long *plVar2;
  ulong uVar3;
  size_type *psVar4;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_b0;
  string local_90;
  ulong local_70;
  string local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  uVar1 = 8;
  if ((int)internalFormat < 0x88f0) {
    if (0x81a6 < (int)internalFormat) {
      switch(internalFormat) {
      case 0x8229:
        uVar3 = 0x300000000;
        break;
      case 0x822a:
        uVar3 = 0x400000000;
        break;
      case 0x822b:
        uVar1 = 5;
        goto switchD_018bbf86_caseD_8058;
      case 0x822c:
        uVar1 = 5;
        goto switchD_018bbf86_caseD_805b;
      case 0x822d:
        uVar3 = 0x2200000000;
        break;
      case 0x822e:
        uVar3 = 0x2300000000;
        break;
      case 0x822f:
        uVar1 = 5;
        goto switchD_018bbfec_caseD_881a;
      case 0x8230:
        uVar1 = 5;
        goto switchD_018bbfec_caseD_8814;
      case 0x8231:
        uVar3 = 0x1b00000000;
        break;
      case 0x8232:
        uVar3 = 0x1e00000000;
        break;
      case 0x8233:
        uVar3 = 0x1c00000000;
        break;
      case 0x8234:
        uVar3 = 0x1f00000000;
        break;
      case 0x8235:
        uVar3 = 0x1d00000000;
        break;
      case 0x8236:
        uVar3 = 0x2100000000;
        break;
      case 0x8237:
        uVar1 = 5;
        goto switchD_018bc0c6_caseD_8d8e;
      case 0x8238:
        uVar1 = 5;
        goto switchD_018bbf19_caseD_8d7c;
      case 0x8239:
        uVar1 = 5;
        goto switchD_018bc0c6_caseD_8d88;
      case 0x823a:
        uVar1 = 5;
        goto switchD_018bbf19_caseD_8d76;
      case 0x823b:
        uVar1 = 5;
        goto switchD_018bbf19_caseD_8d82;
      case 0x823c:
        uVar1 = 5;
        goto switchD_018bbf19_caseD_8d70;
      default:
        switch(internalFormat) {
        case 0x8815:
          uVar1 = 7;
        case 0x8814:
switchD_018bbfec_caseD_8814:
          uVar3 = 0x2300000000;
          break;
        case 0x8816:
        case 0x8817:
        case 0x8818:
        case 0x8819:
switchD_018bbfec_caseD_8816:
          this = (InternalError *)__cxa_allocate_exception(0x38);
          local_b0._M_dataplus._M_p = (pointer)&local_b0.field_2;
          std::__cxx11::string::_M_construct<char_const*>
                    ((string *)&local_b0,"Can\'t map GL sized internal format (","");
          local_70 = (ulong)internalFormat;
          tcu::Format::Hex<8ul>::toString_abi_cxx11_(&local_68,&local_70);
          std::operator+(&local_48,&local_b0,&local_68);
          plVar2 = (long *)std::__cxx11::string::append((char *)&local_48);
          local_90._M_dataplus._M_p = (pointer)*plVar2;
          psVar4 = (size_type *)(plVar2 + 2);
          if ((size_type *)local_90._M_dataplus._M_p == psVar4) {
            local_90.field_2._M_allocated_capacity = *psVar4;
            local_90.field_2._8_8_ = plVar2[3];
            local_90._M_dataplus._M_p = (pointer)&local_90.field_2;
          }
          else {
            local_90.field_2._M_allocated_capacity = *psVar4;
          }
          local_90._M_string_length = plVar2[1];
          *plVar2 = (long)psVar4;
          plVar2[1] = 0;
          *(undefined1 *)(plVar2 + 2) = 0;
          tcu::InternalError::InternalError(this,&local_90);
          __cxa_throw(this,&tcu::InternalError::typeinfo,tcu::Exception::~Exception);
        case 0x881b:
          uVar1 = 7;
        case 0x881a:
switchD_018bbfec_caseD_881a:
          uVar3 = 0x2200000000;
          break;
        default:
          if (internalFormat != 0x81a7) goto switchD_018bbfec_caseD_8816;
          uVar1 = 0x12;
          goto switchD_018bbf19_caseD_8d70;
        }
        goto LAB_018bc2fb;
      }
LAB_018bc2f9:
      uVar1 = 0;
      goto LAB_018bc2fb;
    }
    switch(internalFormat) {
    case 0x8051:
      uVar1 = 7;
    case 0x8058:
switchD_018bbf86_caseD_8058:
      uVar3 = 0x300000000;
      goto LAB_018bc2fb;
    case 0x8052:
      uVar1 = 7;
    case 0x8059:
      uVar3 = 0xf00000000;
      goto LAB_018bc2fb;
    case 0x8053:
    case 0x8055:
    case 0x805a:
      goto switchD_018bbfec_caseD_8816;
    case 0x8054:
      uVar1 = 7;
      break;
    case 0x8056:
      uVar3 = 0xa00000000;
      goto LAB_018bc2fb;
    case 0x8057:
      uVar3 = 0xb00000000;
      goto LAB_018bc2fb;
    case 0x805b:
      break;
    default:
      if (internalFormat != 0x81a5) {
        if (internalFormat != 0x81a6) goto switchD_018bbfec_caseD_8816;
        uVar1 = 0x12;
LAB_018bc0e4:
        uVar3 = 0x1900000000;
        goto LAB_018bc2fb;
      }
      uVar1 = 0x12;
    }
switchD_018bbf86_caseD_805b:
    uVar3 = 0x400000000;
    goto LAB_018bc2fb;
  }
  if ((int)internalFormat < 0x8d88) {
    if ((int)internalFormat < 0x8d48) {
      if (0x8cab < (int)internalFormat) {
        if (internalFormat != 0x8cac) {
          if (internalFormat == 0x8cad) {
            uVar3 = 0x2500000000;
            uVar1 = 0x14;
            goto LAB_018bc2fb;
          }
          goto switchD_018bbfec_caseD_8816;
        }
        uVar1 = 0x12;
        goto switchD_018bbfec_caseD_8814;
      }
      switch(internalFormat) {
      case 0x8c3a:
        uVar3 = 0x1600000000;
        goto LAB_018bc111;
      case 0x8c3b:
      case 0x8c3c:
      case 0x8c3e:
      case 0x8c3f:
      case 0x8c40:
      case 0x8c42:
        goto switchD_018bbfec_caseD_8816;
      case 0x8c3d:
        uVar3 = 0x1700000000;
LAB_018bc111:
        uVar1 = 7;
        goto LAB_018bc2fb;
      case 0x8c41:
        uVar1 = 0xe;
        break;
      case 0x8c43:
        uVar1 = 0xf;
        break;
      default:
        if (internalFormat != 0x88f0) goto switchD_018bbfec_caseD_8816;
        uVar1 = 0x14;
        goto LAB_018bc0e4;
      }
      goto switchD_018bbf86_caseD_8058;
    }
    switch(internalFormat) {
    case 0x8d70:
      goto switchD_018bbf19_caseD_8d70;
    case 0x8d71:
      uVar1 = 7;
      goto switchD_018bbf19_caseD_8d70;
    case 0x8d72:
    case 0x8d73:
    case 0x8d74:
    case 0x8d75:
    case 0x8d78:
    case 0x8d79:
    case 0x8d7a:
    case 0x8d7b:
    case 0x8d7e:
    case 0x8d7f:
    case 0x8d80:
    case 0x8d81:
      goto switchD_018bbfec_caseD_8816;
    case 0x8d76:
      goto switchD_018bbf19_caseD_8d76;
    case 0x8d77:
      uVar1 = 7;
      goto switchD_018bbf19_caseD_8d76;
    case 0x8d7c:
      break;
    case 0x8d7d:
      uVar1 = 7;
      break;
    case 0x8d82:
      goto switchD_018bbf19_caseD_8d82;
    case 0x8d83:
      uVar1 = 7;
      goto switchD_018bbf19_caseD_8d82;
    default:
      if (internalFormat != 0x8d48) {
        if (internalFormat != 0x8d62) goto switchD_018bbfec_caseD_8816;
        uVar3 = 0x800000000;
        goto LAB_018bc111;
      }
      uVar1 = 0x13;
    }
switchD_018bbf19_caseD_8d7c:
    uVar3 = 0x1e00000000;
    goto LAB_018bc2fb;
  }
  if (0x8fbc < (int)internalFormat) {
    if (internalFormat == 0x8fbd) {
      uVar1 = 0xc;
    }
    else {
      if (internalFormat != 0x8fbe) {
        if (internalFormat == 0x906f) {
          uVar3 = 0x1500000000;
          goto LAB_018bc2fb;
        }
        goto switchD_018bbfec_caseD_8816;
      }
      uVar1 = 0xd;
    }
    goto switchD_018bbf86_caseD_8058;
  }
  switch(internalFormat) {
  case 0x8f94:
    uVar1 = 0;
    break;
  case 0x8f95:
    uVar1 = 5;
    break;
  case 0x8f96:
    uVar1 = 7;
    break;
  case 0x8f97:
    break;
  case 0x8f98:
    uVar3 = 0x100000000;
    goto LAB_018bc2f9;
  case 0x8f99:
    uVar1 = 5;
  case 0x8f9b:
switchD_018bc016_caseD_8f9b:
    uVar3 = 0x100000000;
    goto LAB_018bc2fb;
  case 0x8f9a:
    uVar1 = 7;
    goto switchD_018bc016_caseD_8f9b;
  default:
    switch(internalFormat) {
    case 0x8d89:
      uVar1 = 7;
    case 0x8d88:
switchD_018bc0c6_caseD_8d88:
      uVar3 = 0x1c00000000;
      break;
    default:
      goto switchD_018bbfec_caseD_8816;
    case 0x8d8f:
      uVar1 = 7;
    case 0x8d8e:
switchD_018bc0c6_caseD_8d8e:
      uVar3 = 0x1b00000000;
    }
    goto LAB_018bc2fb;
  }
  uVar3 = 0;
LAB_018bc2fb:
  return (TextureFormat)(uVar1 | uVar3);
switchD_018bbf19_caseD_8d82:
  uVar3 = 0x1d00000000;
  goto LAB_018bc2fb;
switchD_018bbf19_caseD_8d76:
  uVar3 = 0x1f00000000;
  goto LAB_018bc2fb;
switchD_018bbf19_caseD_8d70:
  uVar3 = 0x2100000000;
  goto LAB_018bc2fb;
}

Assistant:

tcu::TextureFormat mapGLInternalFormat (deUint32 internalFormat)
{
	using tcu::TextureFormat;
	switch (internalFormat)
	{
		case GL_RGB5_A1:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_SHORT_5551);
		case GL_RGBA4:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_SHORT_4444);
		case GL_RGB565:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_SHORT_565);
		case GL_DEPTH_COMPONENT16:	return TextureFormat(TextureFormat::D,		TextureFormat::UNORM_INT16);
		case GL_STENCIL_INDEX8:		return TextureFormat(TextureFormat::S,		TextureFormat::UNSIGNED_INT8);

		case GL_RGBA32F:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::FLOAT);
		case GL_RGBA32I:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT32);
		case GL_RGBA32UI:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT32);
		case GL_RGBA16:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT16);
		case GL_RGBA16_SNORM:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SNORM_INT16);
		case GL_RGBA16F:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::HALF_FLOAT);
		case GL_RGBA16I:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT16);
		case GL_RGBA16UI:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT16);
		case GL_RGBA8:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT8);
		case GL_RGBA8I:				return TextureFormat(TextureFormat::RGBA,	TextureFormat::SIGNED_INT8);
		case GL_RGBA8UI:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT8);
		case GL_SRGB8_ALPHA8:		return TextureFormat(TextureFormat::sRGBA,	TextureFormat::UNORM_INT8);
		case GL_RGB10_A2:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNORM_INT_1010102_REV);
		case GL_RGB10_A2UI:			return TextureFormat(TextureFormat::RGBA,	TextureFormat::UNSIGNED_INT_1010102_REV);
		case GL_RGBA8_SNORM:		return TextureFormat(TextureFormat::RGBA,	TextureFormat::SNORM_INT8);

		case GL_RGB8:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT8);
		case GL_R11F_G11F_B10F:		return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT_11F_11F_10F_REV);
		case GL_RGB32F:				return TextureFormat(TextureFormat::RGB,	TextureFormat::FLOAT);
		case GL_RGB32I:				return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT32);
		case GL_RGB32UI:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT32);
		case GL_RGB16:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT16);
		case GL_RGB16_SNORM:		return TextureFormat(TextureFormat::RGB,	TextureFormat::SNORM_INT16);
		case GL_RGB16F:				return TextureFormat(TextureFormat::RGB,	TextureFormat::HALF_FLOAT);
		case GL_RGB16I:				return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT16);
		case GL_RGB16UI:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT16);
		case GL_RGB8_SNORM:			return TextureFormat(TextureFormat::RGB,	TextureFormat::SNORM_INT8);
		case GL_RGB8I:				return TextureFormat(TextureFormat::RGB,	TextureFormat::SIGNED_INT8);
		case GL_RGB8UI:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT8);
		case GL_SRGB8:				return TextureFormat(TextureFormat::sRGB,	TextureFormat::UNORM_INT8);
		case GL_RGB9_E5:			return TextureFormat(TextureFormat::RGB,	TextureFormat::UNSIGNED_INT_999_E5_REV);
		case GL_RGB10:				return TextureFormat(TextureFormat::RGB,	TextureFormat::UNORM_INT_1010102_REV);

		case GL_RG32F:				return TextureFormat(TextureFormat::RG,		TextureFormat::FLOAT);
		case GL_RG32I:				return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT32);
		case GL_RG32UI:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT32);
		case GL_RG16:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNORM_INT16);
		case GL_RG16_SNORM:			return TextureFormat(TextureFormat::RG,		TextureFormat::SNORM_INT16);
		case GL_RG16F:				return TextureFormat(TextureFormat::RG,		TextureFormat::HALF_FLOAT);
		case GL_RG16I:				return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT16);
		case GL_RG16UI:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT16);
		case GL_RG8:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNORM_INT8);
		case GL_RG8I:				return TextureFormat(TextureFormat::RG,		TextureFormat::SIGNED_INT8);
		case GL_RG8UI:				return TextureFormat(TextureFormat::RG,		TextureFormat::UNSIGNED_INT8);
		case GL_RG8_SNORM:			return TextureFormat(TextureFormat::RG,		TextureFormat::SNORM_INT8);
		case GL_SRG8_EXT:			return TextureFormat(TextureFormat::sRG,	TextureFormat::UNORM_INT8);

		case GL_R32F:				return TextureFormat(TextureFormat::R,		TextureFormat::FLOAT);
		case GL_R32I:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT32);
		case GL_R32UI:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT32);
		case GL_R16:				return TextureFormat(TextureFormat::R,		TextureFormat::UNORM_INT16);
		case GL_R16_SNORM:			return TextureFormat(TextureFormat::R,		TextureFormat::SNORM_INT16);
		case GL_R16F:				return TextureFormat(TextureFormat::R,		TextureFormat::HALF_FLOAT);
		case GL_R16I:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT16);
		case GL_R16UI:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT16);
		case GL_R8:					return TextureFormat(TextureFormat::R,		TextureFormat::UNORM_INT8);
		case GL_R8I:				return TextureFormat(TextureFormat::R,		TextureFormat::SIGNED_INT8);
		case GL_R8UI:				return TextureFormat(TextureFormat::R,		TextureFormat::UNSIGNED_INT8);
		case GL_R8_SNORM:			return TextureFormat(TextureFormat::R,		TextureFormat::SNORM_INT8);
		case GL_SR8_EXT:			return TextureFormat(TextureFormat::sR,		TextureFormat::UNORM_INT8);

		case GL_DEPTH_COMPONENT32F:	return TextureFormat(TextureFormat::D,		TextureFormat::FLOAT);
		case GL_DEPTH_COMPONENT24:	return TextureFormat(TextureFormat::D,		TextureFormat::UNSIGNED_INT_24_8);
		case GL_DEPTH_COMPONENT32:	return TextureFormat(TextureFormat::D,		TextureFormat::UNSIGNED_INT32);
		case GL_DEPTH32F_STENCIL8:	return TextureFormat(TextureFormat::DS,		TextureFormat::FLOAT_UNSIGNED_INT_24_8_REV);
		case GL_DEPTH24_STENCIL8:	return TextureFormat(TextureFormat::DS,		TextureFormat::UNSIGNED_INT_24_8);

		default:
			throw tcu::InternalError(string("Can't map GL sized internal format (") + tcu::toHex(internalFormat).toString() + ") to texture format");
	}
}